

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayoutInfo::separatorRect(QDockAreaLayoutInfo *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  qsizetype qVar3;
  const_reference len;
  QDockAreaLayoutInfo *in_RSI;
  long in_FS_OFFSET;
  QRect QVar4;
  QDockAreaLayoutItem *item;
  int index;
  qsizetype in_stack_ffffffffffffff88;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb0;
  int index_00;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined1 local_30 [16];
  undefined1 auVar6 [12];
  
  index_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = QList<int>::first((QList<int> *)in_stack_ffffffffffffff90);
  iVar5 = *piVar2;
  qVar3 = QList<int>::size((QList<int> *)in_RSI);
  if (qVar3 < 2) {
    local_30 = (undefined1  [16])
               separatorRect((QDockAreaLayoutInfo *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                             index_00);
  }
  else {
    len = QList<QDockAreaLayoutItem>::at(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QList<int>::mid((QList<int> *)in_RSI,CONCAT44(iVar5,in_stack_ffffffffffffffb8),(qsizetype)len);
    local_30 = (undefined1  [16])
               separatorRect(in_RSI,(QList<int> *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
    QList<int>::~QList((QList<int> *)0x57233d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar4.x1.m_i = local_30._0_4_;
    auVar6._4_4_ = local_30._4_4_;
    QVar4.x2.m_i = local_30._8_4_;
    QVar4.y2.m_i = local_30._12_4_;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayoutInfo::separatorRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list.at(index);
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->separatorRect(path.mid(1));
    }
    return separatorRect(index);
}